

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Thing_SetTranslation
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  DWORD DVar1;
  AActor *pAVar2;
  AActor *pAVar3;
  int iVar4;
  DWORD DVar5;
  TActorIterator<AActor> iterator;
  
  iterator.super_FActorIterator.base = (AActor *)0x0;
  if (it == (AActor *)0x0 || arg1 != -1) {
    if (arg1 - 1U < 0xfffe) {
      DVar5 = arg1 - 1U | 0x40000;
    }
    else {
      DVar5 = 0x30007;
      if (arg1 != 0x100007) {
        DVar5 = 0;
      }
    }
  }
  else {
    DVar5 = it->Translation;
  }
  iterator.super_FActorIterator.id = arg0;
  if (arg0 == 0) {
    if (it == (AActor *)0x0) {
      iVar4 = 0;
    }
    else {
      if (DVar5 == 0) {
        pAVar2 = AActor::GetDefault(it);
        DVar5 = pAVar2->Translation;
      }
      it->Translation = DVar5;
      iVar4 = 1;
    }
  }
  else {
    iVar4 = 0;
    while( true ) {
      pAVar2 = TActorIterator<AActor>::Next(&iterator);
      if (pAVar2 == (AActor *)0x0) break;
      DVar1 = DVar5;
      if (DVar5 == 0) {
        pAVar3 = AActor::GetDefault(pAVar2);
        DVar1 = pAVar3->Translation;
      }
      pAVar2->Translation = DVar1;
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

FUNC(LS_Thing_SetTranslation)
// Thing_SetTranslation (tid, range)
{
	TActorIterator<AActor> iterator (arg0);
	int range;
	AActor *target;
	bool ok = false;

	if (arg1 == -1 && it != NULL)
	{
		range = it->Translation;
	}
	else if (arg1 >= 1 && arg1 < MAX_ACS_TRANSLATIONS)
	{
		range = TRANSLATION(TRANSLATION_LevelScripted, (arg1-1));
	}
	else if (arg1 == TRANSLATION_ICE)
	{
		range = TRANSLATION(TRANSLATION_Standard, 7);
	}
	else
	{
		range = 0;
	}

	if (arg0 == 0)
	{
		if (it != NULL)
		{
			ok = true;
			it->Translation = range==0? it->GetDefault()->Translation : range;
		}
	}
	else
	{
		while ( (target = iterator.Next ()) )
		{
			ok = true;
			target->Translation = range==0? target->GetDefault()->Translation : range;
		}
	}

	return ok;
}